

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O0

void __thiscall acto::intrusive::spin_lock::unlock(spin_lock *this)

{
  spin_lock *this_local;
  memory_order __b;
  
  std::operator&(release,__memory_order_mask);
  (this->flag_).super___atomic_flag_base._M_i = false;
  std::__atomic_notify_address<bool>((bool *)this,false);
  return;
}

Assistant:

void unlock() noexcept {
    flag_.clear(std::memory_order_release);
#if defined(__cpp_lib_atomic_wait) && __cpp_lib_atomic_wait >= 201907L
    flag_.notify_one();
#endif
  }